

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Input::preflightElement(Input *this,uint Index,void **SaveInfo)

{
  bool bVar1;
  ret_type pSVar2;
  reference this_00;
  pointer pHVar3;
  SequenceHNode *SQ;
  void **SaveInfo_local;
  uint Index_local;
  Input *this_local;
  
  bVar1 = std::error_code::operator_cast_to_bool(&this->EC);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pSVar2 = dyn_cast<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
    if (pSVar2 == (ret_type)0x0) {
      this_local._7_1_ = false;
    }
    else {
      *SaveInfo = this->CurrentNode;
      this_00 = std::
                vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                ::operator[](&pSVar2->Entries,(ulong)Index);
      pHVar3 = std::
               unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
               ::get(this_00);
      this->CurrentNode = pHVar3;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Input::preflightElement(unsigned Index, void *&SaveInfo) {
  if (EC)
    return false;
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    SaveInfo = CurrentNode;
    CurrentNode = SQ->Entries[Index].get();
    return true;
  }
  return false;
}